

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashlist.c
# Opt level: O3

ktx_error_code_e ktxHashList_DeleteKVPair(ktxHashList *pHead,char *key)

{
  uint *puVar1;
  ktxHashList pkVar2;
  UT_hash_table *pUVar3;
  UT_hash_bucket *pUVar4;
  UT_hash_handle *pUVar5;
  long lVar6;
  ktx_error_code_e kVar7;
  size_t sVar8;
  char *pcVar9;
  uint uVar10;
  uint uVar11;
  int iVar12;
  uint uVar13;
  ktxHashList pkVar14;
  long lVar15;
  uint uVar16;
  ulong uVar17;
  uint uVar18;
  uint uVar19;
  
  kVar7 = KTX_INVALID_VALUE;
  if (key != (char *)0x0 && pHead != (ktxHashList *)0x0) {
    pkVar2 = *pHead;
    if (pkVar2 != (ktxHashList)0x0) {
      sVar8 = strlen(key);
      uVar11 = (uint)sVar8;
      pcVar9 = key;
      if (uVar11 < 0xc) {
        uVar13 = 0x9e3779b9;
        uVar16 = 0xfeedbeef;
        uVar18 = 0x9e3779b9;
        uVar10 = uVar11;
      }
      else {
        uVar16 = 0xfeedbeef;
        uVar18 = 0x9e3779b9;
        uVar17 = sVar8 & 0xffffffff;
        uVar13 = 0x9e3779b9;
        do {
          iVar12 = (uint)(byte)pcVar9[7] * 0x1000000 + pcVar9[6] * 0x10000 +
                   pcVar9[5] * 0x100 + (int)pcVar9[4] + uVar18;
          uVar10 = (uint)(byte)pcVar9[0xb] * 0x1000000 + pcVar9[10] * 0x10000 +
                   pcVar9[9] * 0x100 + (int)pcVar9[8] + uVar16;
          uVar18 = uVar10 >> 0xd ^
                   (((uint)(byte)pcVar9[3] * 0x1000000 + pcVar9[2] * 0x10000 +
                    pcVar9[1] * 0x100 + (int)*pcVar9 + uVar13) - iVar12) - uVar10;
          uVar16 = uVar18 << 8 ^ (iVar12 - uVar10) - uVar18;
          uVar13 = uVar16 >> 0xd ^ (uVar10 - uVar18) - uVar16;
          uVar10 = uVar13 >> 0xc ^ (uVar18 - uVar16) - uVar13;
          uVar16 = uVar10 << 0x10 ^ (uVar16 - uVar13) - uVar10;
          uVar19 = uVar16 >> 5 ^ (uVar13 - uVar10) - uVar16;
          uVar13 = uVar19 >> 3 ^ (uVar10 - uVar16) - uVar19;
          uVar18 = uVar13 << 10 ^ (uVar16 - uVar19) - uVar13;
          uVar16 = uVar18 >> 0xf ^ (uVar19 - uVar13) - uVar18;
          pcVar9 = pcVar9 + 0xc;
          uVar10 = (int)uVar17 - 0xc;
          uVar17 = (ulong)uVar10;
        } while (0xb < uVar10);
      }
      uVar16 = uVar16 + uVar11;
      switch(uVar10) {
      case 0xb:
        uVar16 = (uint)(byte)pcVar9[10] * 0x1000000 + uVar16;
      case 10:
        uVar16 = pcVar9[9] * 0x10000 + uVar16;
      case 9:
        uVar16 = pcVar9[8] * 0x100 + uVar16;
      case 8:
        uVar18 = (uint)(byte)pcVar9[7] * 0x1000000 + uVar18;
      case 7:
        uVar18 = pcVar9[6] * 0x10000 + uVar18;
      case 6:
        uVar18 = pcVar9[5] * 0x100 + uVar18;
      case 5:
        uVar18 = (int)pcVar9[4] + uVar18;
      case 4:
        uVar13 = (uint)(byte)pcVar9[3] * 0x1000000 + uVar13;
      case 3:
        uVar13 = pcVar9[2] * 0x10000 + uVar13;
      case 2:
        uVar13 = pcVar9[1] * 0x100 + uVar13;
      case 1:
        uVar13 = (int)*pcVar9 + uVar13;
      }
      uVar10 = uVar16 >> 0xd ^ (uVar13 - uVar16) - uVar18;
      uVar18 = uVar10 << 8 ^ (uVar18 - uVar16) - uVar10;
      uVar16 = uVar18 >> 0xd ^ (uVar16 - uVar10) - uVar18;
      uVar13 = uVar16 >> 0xc ^ (uVar10 - uVar18) - uVar16;
      uVar10 = uVar13 << 0x10 ^ (uVar18 - uVar16) - uVar13;
      uVar16 = uVar10 >> 5 ^ (uVar16 - uVar13) - uVar10;
      uVar13 = uVar16 >> 3 ^ (uVar13 - uVar10) - uVar16;
      uVar10 = uVar13 << 10 ^ (uVar10 - uVar16) - uVar13;
      pUVar3 = (pkVar2->hh).tbl;
      pUVar4 = pUVar3->buckets;
      pUVar5 = pUVar4[pUVar3->num_buckets - 1 & (uVar10 >> 0xf ^ uVar16 - (uVar13 + uVar10))].
               hh_head;
      if (pUVar5 != (UT_hash_handle *)0x0) {
        lVar15 = (long)pUVar5 - pUVar3->hho;
        while ((*(uint *)(lVar15 + 0x50) != uVar11 ||
               (iVar12 = bcmp(*(void **)(lVar15 + 0x48),key,sVar8 & 0xffffffff), iVar12 != 0))) {
          if (*(long *)(lVar15 + 0x40) == 0) goto LAB_001cd428;
          lVar15 = *(long *)(lVar15 + 0x40) - pUVar3->hho;
        }
        lVar6 = *(long *)(lVar15 + 0x28);
        if ((lVar6 == 0) && (*(long *)(lVar15 + 0x30) == 0)) {
          free(pUVar4);
          free(((*pHead)->hh).tbl);
          *pHead = (ktxHashList)0x0;
        }
        else {
          if (lVar15 == (long)pUVar3->tail - pUVar3->hho) {
            pUVar3->tail = (UT_hash_handle *)(pUVar3->hho + lVar6);
          }
          pkVar2 = *(ktxHashList *)(lVar15 + 0x30);
          if (lVar6 == 0) {
            *pHead = pkVar2;
            pkVar14 = pkVar2;
          }
          else {
            *(ktxHashList *)(lVar6 + 0x10 + (((*pHead)->hh).tbl)->hho) = pkVar2;
            pkVar14 = *pHead;
          }
          if (pkVar2 != (ktxHashList)0x0) {
            *(undefined8 *)((long)&pkVar2->key + ((pkVar14->hh).tbl)->hho) =
                 *(undefined8 *)(lVar15 + 0x28);
            pkVar14 = *pHead;
          }
          pUVar3 = (pkVar14->hh).tbl;
          uVar11 = pUVar3->num_buckets - 1 & *(uint *)(lVar15 + 0x54);
          pUVar4 = pUVar3->buckets;
          pUVar4[uVar11].count = pUVar4[uVar11].count - 1;
          if (pUVar4[uVar11].hh_head == (UT_hash_handle *)(lVar15 + 0x20)) {
            pUVar4[uVar11].hh_head = *(UT_hash_handle **)(lVar15 + 0x40);
          }
          lVar6 = *(long *)(lVar15 + 0x38);
          lVar15 = *(long *)(lVar15 + 0x40);
          if (lVar6 != 0) {
            *(long *)(lVar6 + 0x20) = lVar15;
          }
          if (lVar15 != 0) {
            *(long *)(lVar15 + 0x18) = lVar6;
          }
          puVar1 = &(((*pHead)->hh).tbl)->num_items;
          *puVar1 = *puVar1 - 1;
        }
      }
    }
LAB_001cd428:
    kVar7 = KTX_SUCCESS;
  }
  return kVar7;
}

Assistant:

KTX_error_code
ktxHashList_DeleteKVPair(ktxHashList* pHead, const char* key)
{
    if (pHead && key) {
        ktxKVListEntry* kv;

        HASH_FIND_STR( *pHead, key, kv );  /* kv: pointer to target entry. */
        if (kv != NULL)
            HASH_DEL(*pHead, kv);
        return KTX_SUCCESS;
    } else
        return KTX_INVALID_VALUE;
}